

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>
fmt::v8::detail::
do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>
          (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> out,big_decimal_fp *fp,
          basic_format_specs<char16_t> *specs,float_specs fspecs,locale_ref loc)

{
  int iVar1;
  int iVar2;
  char16_t cVar3;
  type tVar4;
  type tVar5;
  int iVar6;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> bVar7;
  int iVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  sign_t sVar14;
  bool bVar15;
  bool pointy;
  undefined3 uStack_107;
  char16_t local_104;
  char16_t zero;
  int significand_size;
  sign_t sign;
  locale_ref local_f8;
  ulong local_f0;
  back_insert_iterator<fmt::v8::detail::buffer<char16_t>_> local_e8;
  basic_format_specs<char16_t> *local_e0;
  ulong local_d8;
  char *significand;
  int local_c8;
  int exp;
  char *local_c0;
  float_specs fspecs_local;
  digit_grouping<char16_t> grouping;
  anon_class_40_8_70a3e612 write;
  anon_class_12_2_f0c9b3c6 use_exp_format;
  
  significand = fp->significand;
  iVar6 = fp->significand_size;
  zero = L'0';
  sVar14 = fspecs._4_4_ >> 8;
  sign = sVar14 & 0xff;
  bVar15 = sign != none;
  significand_size = iVar6;
  local_f8.locale_ = loc.locale_;
  local_e8.container = out.container;
  local_e0 = specs;
  local_c0 = significand;
  fspecs_local = fspecs;
  tVar4 = to_unsigned<int>(iVar6);
  local_f0 = (ulong)(bVar15 + tVar4);
  cVar3 = L'.';
  local_d8 = (ulong)fspecs >> 0x20;
  if ((fspecs._4_4_ >> 0x11 & 1) != 0) {
    cVar3 = decimal_point<char16_t>(local_f8);
  }
  iVar8 = fp->exponent;
  local_c8 = iVar8 + iVar6 + -1;
  local_104 = cVar3;
  use_exp_format.fspecs = fspecs;
  use_exp_format.output_exp = local_c8;
  bVar15 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::big_decimal_fp,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
           ::anon_class_12_2_f0c9b3c6::operator()(&use_exp_format);
  uVar11 = local_f0;
  uVar9 = fspecs.precision;
  uVar12 = (uint)local_d8;
  if (bVar15) {
    iVar8 = iVar8 + iVar6;
    if ((uVar12 >> 0x14 & 1) == 0) {
      local_f8.locale_ = (void *)((ulong)local_f8.locale_._4_4_ << 0x20);
      if (iVar6 == 1) {
        cVar3 = L'\0';
      }
    }
    else {
      local_f8.locale_._0_4_ = 0;
      if (0 < (int)(uVar9 - iVar6)) {
        local_f8.locale_._0_4_ = uVar9 - iVar6;
      }
      tVar4 = to_unsigned<int>((int)local_f8.locale_);
      uVar11 = local_f0 + tVar4;
    }
    iVar2 = local_c8;
    iVar1 = 1 - iVar8;
    if (0 < iVar8) {
      iVar1 = local_c8;
    }
    iVar8 = 2;
    if (99 < iVar1) {
      iVar8 = (999 < iVar1) + 3;
    }
    tVar4 = to_unsigned<int>((3 - (uint)(cVar3 == L'\0')) + iVar8);
    write._0_8_ = CONCAT44(write._4_4_,sVar14) & 0xffffffff000000ff;
    write.significand = local_c0;
    write.decimal_point = cVar3;
    write.significand_size = iVar6;
    write._24_6_ = CONCAT24(L'0',(int)local_f8.locale_);
    write._24_8_ = CONCAT17(write._31_1_,CONCAT16(((uVar12 >> 0x10 & 1) == 0) << 5,write._24_6_)) |
                   0x45000000000000;
    write.output_exp = iVar2;
    if (0 < local_e0->width) {
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_1_&>
                        (local_e8,local_e0,uVar11 + tVar4,&write);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar7.container;
    }
    bVar7 = do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>,_fmt::v8::detail::big_decimal_fp,_char16_t,_fmt::v8::detail::digit_grouping<char16_t>_>
            ::anon_class_40_8_70a3e612::operator()(&write,local_e8.container);
    return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar7.container;
  }
  iVar1 = fp->exponent;
  iVar8 = iVar1 + iVar6;
  exp = iVar8;
  if (iVar1 < 0) {
    if (iVar8 < 1) {
      uVar13 = -iVar8;
      grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar13;
      if (uVar9 < uVar13) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar9;
      }
      if ((int)uVar9 < 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar13;
      }
      if (iVar6 != 0) {
        grouping.sep_.grouping._M_dataplus._M_p._0_4_ = uVar13;
      }
      if (iVar6 == 0 && (uint)grouping.sep_.grouping._M_dataplus._M_p == 0) {
        _pointy = CONCAT31(uStack_107,(char)((uVar12 & 0x100000) >> 0x14));
        if ((local_d8 & 0x100000) == 0) {
          iVar6 = 1;
          goto LAB_00195867;
        }
      }
      else {
        _pointy = CONCAT31(uStack_107,1);
      }
      iVar6 = 2;
LAB_00195867:
      tVar4 = to_unsigned<int>((uint)grouping.sep_.grouping._M_dataplus._M_p);
      write._0_8_ = &sign;
      write.significand = (char *)&zero;
      write._24_8_ = &local_104;
      write._32_8_ = &grouping;
      write._16_8_ = &pointy;
      bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_4_>
                        (local_e8,local_e0,(iVar6 + tVar4) + uVar11,
                         (anon_class_56_7_162c6e41 *)&write);
      return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar7.container;
    }
    _pointy = uVar9 - iVar6 & (int)(uVar12 << 0xb) >> 0x1f;
    uVar9 = _pointy;
    if ((int)_pointy < 1) {
      uVar9 = 0;
    }
    tVar4 = to_unsigned<int>(uVar9);
    digit_grouping<char16_t>::digit_grouping(&grouping,local_f8,(bool)((byte)(uVar12 >> 0x11) & 1));
    iVar6 = digit_grouping<char16_t>::count_separators(&grouping,significand_size);
    tVar5 = to_unsigned<int>(iVar6);
    write._0_8_ = &sign;
    write.significand = (char *)&significand;
    write._16_8_ = &significand_size;
    write._24_8_ = &exp;
    write._32_8_ = &local_104;
    bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_3_>
                      (local_e8,local_e0,(ulong)tVar5 + (tVar4 + 1) + local_f0,
                       (anon_class_64_8_e6ffa566 *)&write);
    goto LAB_0019580b;
  }
  tVar4 = to_unsigned<int>(iVar1);
  lVar10 = tVar4 + local_f0;
  _pointy = uVar9 - iVar8;
  uVar9 = (uint)local_d8;
  if ((uVar9 >> 0x14 & 1) != 0) {
    if ((char)local_d8 == '\x02' || 0 < (int)_pointy) {
      if ((int)_pointy < 1) goto LAB_0019577b;
    }
    else {
      _pointy = 1;
    }
    tVar4 = to_unsigned<int>(_pointy);
    lVar10 = lVar10 + (ulong)(tVar4 + 1);
  }
LAB_0019577b:
  digit_grouping<char16_t>::digit_grouping(&grouping,local_f8,(bool)((byte)(uVar9 >> 0x11) & 1));
  iVar6 = digit_grouping<char16_t>::count_separators(&grouping,significand_size);
  tVar4 = to_unsigned<int>(iVar6);
  write._0_8_ = &sign;
  write.significand = (char *)&significand;
  write._16_8_ = &significand_size;
  write._24_8_ = fp;
  write._32_8_ = &grouping;
  bVar7 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,char16_t,fmt::v8::detail::do_write_float<std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp,char16_t,fmt::v8::detail::digit_grouping<char16_t>>(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>,fmt::v8::detail::big_decimal_fp_const&,fmt::v8::basic_format_specs<char16_t>const&,fmt::v8::detail::float_specs,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<char16_t>>)_2_>
                    (local_e8,local_e0,lVar10 + (ulong)tVar4,(anon_class_72_9_d68ba176 *)&write);
LAB_0019580b:
  std::__cxx11::string::~string((string *)&grouping);
  return (back_insert_iterator<fmt::v8::detail::buffer<char16_t>_>)bVar7.container;
}

Assistant:

FMT_CONSTEXPR20 auto do_write_float(OutputIt out, const DecimalFP& fp,
                                    const basic_format_specs<Char>& specs,
                                    float_specs fspecs, locale_ref loc)
    -> OutputIt {
  auto significand = fp.significand;
  int significand_size = get_significand_size(fp);
  constexpr Char zero = static_cast<Char>('0');
  auto sign = fspecs.sign;
  size_t size = to_unsigned(significand_size) + (sign ? 1 : 0);
  using iterator = reserve_iterator<OutputIt>;

  Char decimal_point =
      fspecs.locale ? detail::decimal_point<Char>(loc) : static_cast<Char>('.');

  int output_exp = fp.exponent + significand_size - 1;
  auto use_exp_format = [=]() {
    if (fspecs.format == float_format::exp) return true;
    if (fspecs.format != float_format::general) return false;
    // Use the fixed notation if the exponent is in [exp_lower, exp_upper),
    // e.g. 0.0001 instead of 1e-04. Otherwise use the exponent notation.
    const int exp_lower = -4, exp_upper = 16;
    return output_exp < exp_lower ||
           output_exp >= (fspecs.precision > 0 ? fspecs.precision : exp_upper);
  };
  if (use_exp_format()) {
    int num_zeros = 0;
    if (fspecs.showpoint) {
      num_zeros = fspecs.precision - significand_size;
      if (num_zeros < 0) num_zeros = 0;
      size += to_unsigned(num_zeros);
    } else if (significand_size == 1) {
      decimal_point = Char();
    }
    auto abs_output_exp = output_exp >= 0 ? output_exp : -output_exp;
    int exp_digits = 2;
    if (abs_output_exp >= 100) exp_digits = abs_output_exp >= 1000 ? 4 : 3;

    size += to_unsigned((decimal_point ? 1 : 0) + 2 + exp_digits);
    char exp_char = fspecs.upper ? 'E' : 'e';
    auto write = [=](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      // Insert a decimal point after the first digit and add an exponent.
      it = write_significand(it, significand, significand_size, 1,
                             decimal_point);
      if (num_zeros > 0) it = detail::fill_n(it, num_zeros, zero);
      *it++ = static_cast<Char>(exp_char);
      return write_exponent<Char>(output_exp, it);
    };
    return specs.width > 0 ? write_padded<align::right>(out, specs, size, write)
                           : base_iterator(out, write(reserve(out, size)));
  }

  int exp = fp.exponent + significand_size;
  if (fp.exponent >= 0) {
    // 1234e5 -> 123400000[.0+]
    size += to_unsigned(fp.exponent);
    int num_zeros = fspecs.precision - exp;
#ifdef FMT_FUZZ
    if (num_zeros > 5000)
      throw std::runtime_error("fuzz mode - avoiding excessive cpu use");
#endif
    if (fspecs.showpoint) {
      if (num_zeros <= 0 && fspecs.format != float_format::fixed) num_zeros = 1;
      if (num_zeros > 0) size += to_unsigned(num_zeros) + 1;
    }
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand<Char>(it, significand, significand_size,
                                   fp.exponent, grouping);
      if (!fspecs.showpoint) return it;
      *it++ = decimal_point;
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  } else if (exp > 0) {
    // 1234e-2 -> 12.34[0+]
    int num_zeros = fspecs.showpoint ? fspecs.precision - significand_size : 0;
    size += 1 + to_unsigned(num_zeros > 0 ? num_zeros : 0);
    auto grouping = Grouping(loc, fspecs.locale);
    size += to_unsigned(grouping.count_separators(significand_size));
    return write_padded<align::right>(out, specs, size, [&](iterator it) {
      if (sign) *it++ = detail::sign<Char>(sign);
      it = write_significand(it, significand, significand_size, exp,
                             decimal_point, grouping);
      return num_zeros > 0 ? detail::fill_n(it, num_zeros, zero) : it;
    });
  }
  // 1234e-6 -> 0.001234
  int num_zeros = -exp;
  if (significand_size == 0 && fspecs.precision >= 0 &&
      fspecs.precision < num_zeros) {
    num_zeros = fspecs.precision;
  }
  bool pointy = num_zeros != 0 || significand_size != 0 || fspecs.showpoint;
  size += 1 + (pointy ? 1 : 0) + to_unsigned(num_zeros);
  return write_padded<align::right>(out, specs, size, [&](iterator it) {
    if (sign) *it++ = detail::sign<Char>(sign);
    *it++ = zero;
    if (!pointy) return it;
    *it++ = decimal_point;
    it = detail::fill_n(it, num_zeros, zero);
    return write_significand<Char>(it, significand, significand_size);
  });
}